

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http.c
# Opt level: O1

char * Curl_copy_header_value(char *header)

{
  char *__s;
  char cVar1;
  char *pcVar2;
  size_t sVar3;
  char *__dest;
  char *pcVar4;
  long lVar5;
  long lVar6;
  
  for (lVar6 = 0; (cVar1 = header[lVar6], cVar1 != '\0' && (cVar1 != ':')); lVar6 = lVar6 + 1) {
  }
  pcVar4 = header + (cVar1 != '\0');
  lVar5 = 1 - lVar6;
  for (; ((cVar1 = pcVar4[lVar6], cVar1 == '\t' || (cVar1 == ' ')) ||
         ((cVar1 != '\0' && ((byte)(cVar1 - 10U) < 4)))); lVar6 = lVar6 + 1) {
    lVar5 = lVar5 + -1;
  }
  __s = pcVar4 + lVar6;
  pcVar2 = strchr(__s,0xd);
  if (pcVar2 == (char *)0x0) {
    pcVar2 = strchr(__s,10);
  }
  if (pcVar2 == (char *)0x0) {
    sVar3 = strlen(__s);
    pcVar2 = __s + sVar3;
  }
  if (pcVar2 != (char *)0x0) {
    for (; (__s < pcVar2 &&
           (((cVar1 = *pcVar2, cVar1 == '\t' || (cVar1 == ' ')) || ((byte)(cVar1 - 10U) < 4))));
        pcVar2 = pcVar2 + -1) {
    }
    __dest = (char *)(*Curl_cmalloc)((size_t)(pcVar2 + (-lVar6 - (long)pcVar4) + 2));
    if (__dest != (char *)0x0) {
      memcpy(__dest,__s,(size_t)(pcVar2 + (-lVar6 - (long)pcVar4) + 1));
      __dest[(long)(pcVar2 + (lVar5 - (long)pcVar4))] = '\0';
      return __dest;
    }
  }
  return (char *)0x0;
}

Assistant:

char *Curl_copy_header_value(const char *header)
{
  const char *start;
  const char *end;
  char *value;
  size_t len;

  /* Find the end of the header name */
  while(*header && (*header != ':'))
    ++header;

  if(*header)
    /* Skip over colon */
    ++header;

  /* Find the first non-space letter */
  start = header;
  while(*start && ISSPACE(*start))
    start++;

  /* data is in the host encoding so
     use '\r' and '\n' instead of 0x0d and 0x0a */
  end = strchr(start, '\r');
  if(!end)
    end = strchr(start, '\n');
  if(!end)
    end = strchr(start, '\0');
  if(!end)
    return NULL;

  /* skip all trailing space letters */
  while((end > start) && ISSPACE(*end))
    end--;

  /* get length of the type */
  len = end - start + 1;

  value = malloc(len + 1);
  if(!value)
    return NULL;

  memcpy(value, start, len);
  value[len] = 0; /* null-terminate */

  return value;
}